

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O1

int log_add_fp(FILE *fp,int level)

{
  Callback *pCVar1;
  ulong uVar2;
  Callback *pCVar3;
  ulong uVar4;
  Callback *pCVar5;
  bool bVar6;
  
  if (L.callbacks[0].fn == (log_LogFn)0x0) {
    pCVar3 = L.callbacks;
    bVar6 = false;
  }
  else {
    uVar2 = 0;
    pCVar5 = L.callbacks;
    do {
      uVar4 = uVar2;
      bVar6 = 0x1e < uVar4;
      if (uVar4 == 0x1f) goto LAB_0010687b;
      pCVar3 = pCVar5 + 1;
      pCVar1 = pCVar5 + 1;
      uVar2 = uVar4 + 1;
      pCVar5 = pCVar3;
    } while (pCVar1->fn != (log_LogFn)0x0);
    bVar6 = 0x1e < uVar4;
  }
  pCVar3->fn = file_callback;
  pCVar3->udata = fp;
  pCVar3->level = level;
LAB_0010687b:
  return -(uint)bVar6;
}

Assistant:

int log_add_callback(log_LogFn fn, void *udata, int level) {
    for (int i = 0; i < MAX_CALLBACKS; i++) {
        if (!L.callbacks[i].fn) {
            L.callbacks[i] = (Callback){fn, udata, level};
            return 0;
        }
    }
    return -1;
}